

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::GzipAsyncInputStream::readImpl
          (GzipAsyncInputStream *this,byte *out,size_t minBytes,size_t maxBytes,size_t alreadyRead)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  uint uVar3;
  void *pvVar4;
  PromiseBase PVar5;
  long in_R9;
  ulong uVar6;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_gzip_c__:202:15)>
  *location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a0;
  int inflateResult;
  undefined4 uStack_94;
  OwnPromiseNode local_90;
  DebugComparison<int,_int> _kjCondition;
  OwnPromiseNode intermediate;
  Fault f;
  OwnPromiseNode local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  local_90.ptr = (PromiseNode *)this;
  if (*(int *)(out + 0x18) == 0) {
    (**(code **)(**(long **)(out + 8) + 8))(&local_a0,*(long **)(out + 8),out + 0x81,1,0x1000);
    _inflateResult =
         kj::_::
         SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++:202:15)>
         ::anon_class_40_5_e4abd3ac_for_func::operator();
    pPVar1 = ((local_a0.ptr)->super_PromiseArenaMember).arena;
    _kjCondition._0_8_ = out;
    _kjCondition.op.content.ptr = (char *)minBytes;
    _kjCondition.op.content.size_ = maxBytes;
    _kjCondition._24_8_ = alreadyRead;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_a0.ptr - (long)pPVar1) < 0x48) {
      pvVar4 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_gzip_c__:202:15)>
                     *)((long)pvVar4 + 0x3b8);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::GzipAsyncInputStream::readImpl(unsigned_char*,unsigned_long,unsigned_long,unsigned_long)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::GzipAsyncInputStream::readImpl(unsigned_char*,unsigned_long,unsigned_long,unsigned_long)::__0,void*&>
                (location_00,&local_a0,(anon_class_40_5_e4abd3ac_for_func *)&_kjCondition,
                 (void **)&inflateResult);
      *(void **)((long)pvVar4 + 0x3c0) = pvVar4;
    }
    else {
      ((local_a0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_gzip_c__:202:15)>
                     *)&local_a0.ptr[-5].super_PromiseArenaMember.arena;
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::GzipAsyncInputStream::readImpl(unsigned_char*,unsigned_long,unsigned_long,unsigned_long)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::GzipAsyncInputStream::readImpl(unsigned_char*,unsigned_long,unsigned_long,unsigned_long)::__0,void*&>
                (location_00,&local_a0,(anon_class_40_5_e4abd3ac_for_func *)&_kjCondition,
                 (void **)&inflateResult);
      local_a0.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    f.exception = (Exception *)&DAT_003d3151;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<unsigned_long>(&local_40,(Promise<unsigned_long> *)&intermediate,location);
    OVar2.ptr = local_40.ptr;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
    PVar5.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_90.ptr;
    ((local_90.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)OVar2.ptr;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a0);
  }
  else {
    *(size_t *)(out + 0x28) = minBytes;
    *(int *)(out + 0x30) = (int)alreadyRead;
    uVar3 = inflate(out + 0x10,0);
    _inflateResult = (code *)CONCAT44(uStack_94,uVar3);
    out[0x80] = uVar3 == 1;
    if (1 < uVar3) {
      if (*(long *)(out + 0x40) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],int&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                   ,0xeb,FAILED,(char *)0x0,"\"gzip decompression failed\", inflateResult",
                   (char (*) [26])"gzip decompression failed",&inflateResult);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],char*&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                 ,0xed,FAILED,(char *)0x0,"\"gzip decompression failed\", ctx.msg",
                 (char (*) [26])"gzip decompression failed",(char **)(out + 0x40));
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    if ((uVar3 == 1) && (*(int *)(out + 0x18) != 0)) {
      _kjCondition.left = inflateReset(out + 0x10);
      _kjCondition.right = 0;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = _kjCondition.left == 0U;
      if (_kjCondition.left != 0U) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                   ,0xe0,FAILED,"inflateReset(&ctx) == Z_OK","_kjCondition,",&_kjCondition);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    PVar5.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_90.ptr;
    uVar6 = alreadyRead - *(uint *)(out + 0x30);
    if (maxBytes < uVar6 || maxBytes - uVar6 == 0) {
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)local_90.ptr,uVar6 + in_R9);
    }
    else {
      readImpl((GzipAsyncInputStream *)local_90.ptr,out,minBytes + uVar6,maxBytes - uVar6,
               (ulong)*(uint *)(out + 0x30));
    }
  }
  return (Promise<unsigned_long>)(PromiseNode *)PVar5.node.ptr;
}

Assistant:

Promise<size_t> GzipAsyncInputStream::readImpl(
    byte* out, size_t minBytes, size_t maxBytes, size_t alreadyRead) {
  if (ctx.avail_in == 0) {
    return inner.tryRead(buffer, 1, sizeof(buffer))
        .then([this,out,minBytes,maxBytes,alreadyRead](size_t amount) -> Promise<size_t> {
      if (amount == 0) {
        if (!atValidEndpoint) {
          return KJ_EXCEPTION(DISCONNECTED, "gzip compressed stream ended prematurely");
        }
        return alreadyRead;
      } else {
        ctx.next_in = buffer;
        ctx.avail_in = amount;
        return readImpl(out, minBytes, maxBytes, alreadyRead);
      }
    });
  }

  ctx.next_out = out;
  ctx.avail_out = maxBytes;

  auto inflateResult = inflate(&ctx, Z_NO_FLUSH);
  atValidEndpoint = inflateResult == Z_STREAM_END;
  if (inflateResult == Z_OK || inflateResult == Z_STREAM_END) {
    if (atValidEndpoint && ctx.avail_in > 0) {
      // There's more data available. Assume start of new content.
      KJ_ASSERT(inflateReset(&ctx) == Z_OK);
    }

    size_t n = maxBytes - ctx.avail_out;
    if (n >= minBytes) {
      return n + alreadyRead;
    } else {
      return readImpl(out + n, minBytes - n, maxBytes - n, alreadyRead + n);
    }
  } else {
    if (ctx.msg == nullptr) {
      KJ_FAIL_REQUIRE("gzip decompression failed", inflateResult);
    } else {
      KJ_FAIL_REQUIRE("gzip decompression failed", ctx.msg);
    }
  }
}